

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O0

_Bool av1_ext_part_get_partition_decision
                (ExtPartController *ext_part_controller,aom_partition_decision_t *decision)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  aom_ext_part_status_t status;
  
  iVar1 = (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x10),in_RSI);
  return iVar1 == 0;
}

Assistant:

bool av1_ext_part_get_partition_decision(ExtPartController *ext_part_controller,
                                         aom_partition_decision_t *decision) {
  assert(ext_part_controller != NULL);
  assert(ext_part_controller->ready);
  assert(decision != NULL);
  const aom_ext_part_status_t status =
      ext_part_controller->funcs.get_partition_decision(
          ext_part_controller->model, decision);
  if (status != AOM_EXT_PART_OK) return false;
  return true;
}